

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

exr_result_t
exr_start_write(exr_context_t *ctxt,char *filename,exr_default_write_mode_t default_mode,
               exr_context_initializer_t *ctxtdata)

{
  size_t sVar1;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *p_Var2;
  exr_context_t p_Var3;
  exr_result_t eVar4;
  exr_result_t eVar5;
  uint uVar6;
  int iVar7;
  size_t __n;
  char *pcVar8;
  char *pcVar9;
  int *piVar10;
  char *pcVar11;
  ulong uVar12;
  exr_context_t ret;
  exr_context_initializer_t inits;
  exr_context_t local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  exr_context_initializer_t local_c8;
  char local_58 [40];
  
  local_e8 = (exr_context_t)0x0;
  local_c8.error_handler_fn = (exr_error_handler_cb_t)0x0;
  local_c8.max_tile_width = 0;
  local_c8.max_tile_height = 0;
  local_c8.flags = 0;
  local_c8.pad[0] = '\0';
  local_c8.pad[1] = '\0';
  local_c8.pad[2] = '\0';
  local_c8.pad[3] = '\0';
  local_c8.destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  local_c8.max_image_width = 0;
  local_c8.max_image_height = 0;
  local_c8.size_fn = (exr_query_size_func_ptr_t)0x0;
  local_c8.write_fn = (exr_write_func_ptr_t)0x0;
  local_c8.user_data = (void *)0x0;
  local_c8.read_fn = (exr_read_func_ptr_t)0x0;
  local_c8.alloc_fn = (exr_memory_allocation_func_t)0x0;
  local_c8.free_fn = (exr_memory_free_func_t)0x0;
  local_c8.size = 0x68;
  local_c8.zip_level = -2;
  local_c8.dwa_quality = -1.0;
  if (ctxtdata != (exr_context_initializer_t *)0x0) {
    local_c8.error_handler_fn = ctxtdata->error_handler_fn;
    local_c8.alloc_fn = ctxtdata->alloc_fn;
    local_c8.free_fn = ctxtdata->free_fn;
    local_c8.user_data = ctxtdata->user_data;
    local_c8.read_fn = ctxtdata->read_fn;
    local_c8.size_fn = ctxtdata->size_fn;
    local_c8.write_fn = ctxtdata->write_fn;
    local_c8.destroy_fn = ctxtdata->destroy_fn;
    local_c8.max_image_width = ctxtdata->max_image_width;
    local_c8.max_image_height = ctxtdata->max_image_height;
    local_c8.max_tile_width = ctxtdata->max_tile_width;
    local_c8.max_tile_height = ctxtdata->max_tile_height;
    if (0x5f < ctxtdata->size) {
      local_c8.zip_level = ctxtdata->zip_level;
      local_c8.dwa_quality = ctxtdata->dwa_quality;
    }
    if (0x67 < ctxtdata->size) {
      local_c8.pad[0] = '\0';
      local_c8.pad[1] = '\0';
      local_c8.pad[2] = '\0';
      local_c8.pad[3] = '\0';
      local_c8.flags = ctxtdata->flags;
    }
  }
  internal_exr_update_default_handlers(&local_c8);
  if (ctxt == (exr_context_t *)0x0) {
    eVar5 = 3;
    (*local_c8.error_handler_fn)
              ((exr_const_context_t)0x0,3,"Invalid context handle passed to start_read function");
  }
  else {
    if (filename == (char *)0x0) {
      eVar5 = 3;
      (*local_c8.error_handler_fn)
                ((exr_const_context_t)0x0,3,"Invalid filename passed to start_write function");
    }
    else {
      eVar5 = 1;
      eVar4 = internal_exr_alloc_context(&local_e8,&local_c8,EXR_CONTEXT_WRITE,4);
      if (eVar4 == 0) {
        local_e8->do_write = dispatch_write;
        eVar5 = exr_attr_string_create(local_e8,&local_e8->filename,filename);
        p_Var3 = local_e8;
        if ((eVar5 == 0) && (local_c8.write_fn == (exr_write_func_ptr_t)0x0)) {
          eVar5 = 0;
          if (default_mode == EXR_INTERMEDIATE_TEMP_FILE) {
            pcVar11 = (local_e8->filename).str;
            uVar6 = getpid();
            iVar7 = snprintf(local_58,0x20,"tmp.%d",(ulong)uVar6);
            if (iVar7 < 0x20) {
              __n = strlen(local_58);
              uVar12 = (long)(p_Var3->filename).length + __n;
              if (uVar12 < 0x7fffffff) {
                sVar1 = uVar12 + 1;
                pcVar8 = (char *)(*p_Var3->alloc_fn)(sVar1);
                if (pcVar8 == (char *)0x0) {
                  eVar5 = (*p_Var3->print_error)
                                    (p_Var3,1,"Unable to create %lu bytes for temporary filename",
                                     sVar1);
                }
                else {
                  local_d0 = pcVar8;
                  pcVar9 = strrchr(pcVar11,0x2f);
                  pcVar8 = local_d0;
                  (p_Var3->tmp_filename).length = (int32_t)uVar12;
                  (p_Var3->tmp_filename).alloc_size = (int32_t)sVar1;
                  (p_Var3->tmp_filename).str = local_d0;
                  if (pcVar9 == (char *)0x0) {
                    memcpy(local_d0,local_58,__n);
                    memcpy(pcVar8 + __n,pcVar11,(long)(p_Var3->filename).length);
                    pcVar8[uVar12] = '\0';
                  }
                  else {
                    local_d8 = pcVar9 + (1 - (long)pcVar11);
                    local_e0 = pcVar9;
                    memcpy(local_d0,pcVar11,(size_t)local_d8);
                    memcpy(pcVar8 + (long)(pcVar9 + (1 - (long)pcVar11)),local_58,__n);
                    memcpy(pcVar8 + (long)(pcVar9 + (1 - (long)pcVar11)) + __n,local_e0 + 1,
                           (long)(p_Var3->filename).length - (long)local_d8);
                    pcVar8[uVar12] = '\0';
                  }
                  eVar5 = 0;
                }
              }
              else {
                eVar5 = (*p_Var3->standard_error)(p_Var3,1);
              }
            }
            else {
              eVar5 = (*p_Var3->report_error)(p_Var3,3,"Invalid assumption in temporary filename");
            }
          }
          p_Var3 = local_e8;
          if (eVar5 == 0) {
            pcVar11 = (local_e8->tmp_filename).str;
            piVar10 = (int *)local_e8->user_data;
            if (pcVar11 == (char *)0x0) {
              pcVar11 = (local_e8->filename).str;
            }
            *piVar10 = -1;
            local_e8->destroy_fn = default_shutdown;
            local_e8->write_fn = default_write_func;
            eVar5 = 0;
            iVar7 = open(pcVar11,0x80241,0x1b6);
            if (iVar7 < 0) {
              p_Var2 = p_Var3->print_error;
              piVar10 = __errno_location();
              pcVar11 = strerror(*piVar10);
              eVar5 = (*p_Var2)(p_Var3,5,"Unable to open file for write: %s",pcVar11);
            }
            else {
              *piVar10 = iVar7;
            }
          }
        }
        if (eVar5 == 0) {
          eVar5 = 0;
        }
        else {
          exr_finish(&local_e8);
        }
      }
    }
    *ctxt = local_e8;
  }
  return eVar5;
}

Assistant:

exr_result_t
exr_start_write (
    exr_context_t*                   ctxt,
    const char*                      filename,
    exr_default_write_mode_t         default_mode,
    const exr_context_initializer_t* ctxtdata)
{
    int                       rv    = EXR_ERR_UNKNOWN;
    exr_context_t             ret   = NULL;
    exr_context_initializer_t inits = fill_context_data (ctxtdata);

    if (!ctxt)
    {
        inits.error_handler_fn (
            NULL,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid context handle passed to start_read function");
        return EXR_ERR_INVALID_ARGUMENT;
    }

    if (filename)
    {
        rv = internal_exr_alloc_context (
            &ret,
            &inits,
            EXR_CONTEXT_WRITE,
            sizeof (struct _internal_exr_filehandle));
        if (rv == EXR_ERR_SUCCESS)
        {
            ret->do_write = &dispatch_write;

            rv = exr_attr_string_create (
                (exr_context_t) ret, &(ret->filename), filename);

            if (rv == EXR_ERR_SUCCESS)
            {
                if (!inits.write_fn)
                {
                    if (default_mode == EXR_INTERMEDIATE_TEMP_FILE)
                        rv = make_temp_filename (ret);
                    if (rv == EXR_ERR_SUCCESS)
                        rv = default_init_write_file (ret);
                }
            }

            if (rv != EXR_ERR_SUCCESS) exr_finish ((exr_context_t*) &ret);
        }
        else
            rv = EXR_ERR_OUT_OF_MEMORY;
    }
    else
    {
        inits.error_handler_fn (
            NULL,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid filename passed to start_write function");
        rv = EXR_ERR_INVALID_ARGUMENT;
    }

    *ctxt = (exr_context_t) ret;
    return rv;
}